

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall
kj::Path::evalImpl(Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path)

{
  size_t sVar1;
  bool bVar2;
  Vector<kj::String> *parts_00;
  char *pcVar3;
  char *pcVar4;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  StringPtr local_68;
  StringPtr local_58;
  Array<kj::String> local_48;
  
  local_68.content.size_ = (size_t)path.content.ptr;
  local_58.content.ptr = "/";
  local_58.content.size_ = 2;
  local_68.content.ptr = (char *)parts;
  bVar2 = StringPtr::startsWith(&local_68,&local_58);
  if (bVar2) {
    ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
  }
  sVar1 = local_68.content.size_;
  pcVar4 = (char *)0x0;
  do {
    parts_00 = (Vector<kj::String> *)
               ((long)&((ArrayBuilder<kj::String> *)local_68.content.ptr)->ptr + (long)pcVar4);
    pcVar3 = (char *)0x0;
    while( true ) {
      part.size_ = pcVar3 + (long)(pcVar4 + (1 - sVar1));
      if (part.size_ == (char *)0x0) {
        part_00.size_ = 0;
        part_00.ptr = (char *)(local_68.content.size_ + ~(ulong)pcVar4);
        evalPart(this,(Vector<kj::String> *)
                      ((long)&((ArrayBuilder<kj::String> *)local_68.content.ptr)->ptr + (long)pcVar4
                      ),part_00);
        Vector<kj::String>::releaseAsArray(&local_48,(Vector<kj::String> *)this);
        (__return_storage_ptr__->parts).ptr = local_48.ptr;
        (__return_storage_ptr__->parts).size_ = local_48.size_;
        (__return_storage_ptr__->parts).disposer = local_48.disposer;
        local_48.ptr = (String *)0x0;
        local_48.size_ = 0;
        Array<kj::String>::~Array(&local_48);
        return __return_storage_ptr__;
      }
      if (pcVar3[(long)&parts_00->builder] == '/') break;
      pcVar3 = pcVar3 + 1;
    }
    part.ptr = pcVar3;
    evalPart(this,parts_00,part);
    pcVar4 = pcVar3 + (long)(pcVar4 + 1);
  } while( true );
}

Assistant:

Path Path::evalImpl(Vector<String>&& parts, StringPtr path) {
  if (path.startsWith("/")) {
    parts.clear();
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '/') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}